

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day16a.cpp
# Opt level: O3

void day16a::almost_dragon_curve(string *data,int size)

{
  pointer pcVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = (uint)data->_M_string_length;
  std::__cxx11::string::resize((ulong)data,(char)size);
  uVar5 = size + ~uVar4;
  if ((int)uVar4 <= (int)(size + ~uVar4)) {
    uVar5 = uVar4;
  }
  if (-1 < (int)uVar5) {
    pcVar1 = (data->_M_dataplus)._M_p;
    do {
      pcVar1[(int)uVar4] = '0';
      if (uVar5 != 0) {
        uVar3 = 0;
        uVar2 = uVar4;
        do {
          uVar2 = uVar2 - 1;
          pcVar1[uVar3 + (long)(int)uVar4 + 1] = pcVar1[(int)uVar2] == '0' | 0x30;
          uVar3 = uVar3 + 1;
        } while (uVar5 != uVar3);
      }
      uVar5 = uVar4 * 2;
      uVar4 = uVar4 * 2 + 1;
      uVar5 = (uVar5 ^ 0xfffffffe) + size;
      if ((int)uVar4 <= (int)uVar5) {
        uVar5 = uVar4;
      }
    } while (-1 < (int)uVar5);
  }
  return;
}

Assistant:

void almost_dragon_curve(std::string& data, int size) {
		int len = data.size();
		data.resize(size);
		char* ptr = const_cast<char*>(data.data());
		for(;;) {
			int iterations = std::min(len, size - len - 1);
			if(iterations < 0) {
				break;
			}
			ptr[len] = '0';
			for(int i = 0; i < iterations; ++i) {
				ptr[len + i + 1] = ptr[len - i - 1] == '0' ? '1' : '0';
			}
			len = len * 2 + 1;
		}
	}